

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

int __thiscall QSocks5SocketEngine::close(QSocks5SocketEngine *this,int __fd)

{
  long lVar1;
  SocketState SVar2;
  undefined4 uVar3;
  duration<long,_std::ratio<1L,_1000L>_> remaining;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QSocks5SocketEnginePrivate *d;
  QDeadlineTimer deadline;
  QDeadlineTimer *in_stack_ffffffffffffffc8;
  QTcpSocket *pQVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  remaining.__r = (rep)d_func((QSocks5SocketEngine *)0x373b85);
  if ((((QSocks5SocketEnginePrivate *)remaining.__r)->data != (QSocks5Data *)0x0) &&
     (((QSocks5SocketEnginePrivate *)remaining.__r)->data->controlSocket != (QTcpSocket *)0x0)) {
    SVar2 = QAbstractSocket::state((QAbstractSocket *)0x373bc7);
    if (SVar2 == ConnectedState) {
      ms<(char)49,(char)48,(char)48>();
      QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1000l>>
                (in_stack_ffffffffffffffc8,remaining,PreciseTimer);
      do {
        lVar4 = (**(code **)(*(long *)&((QSocks5SocketEnginePrivate *)remaining.__r)->data->
                                       controlSocket->super_QAbstractSocket + 0xa8))();
        if (lVar4 != 0) break;
        pQVar6 = ((QSocks5SocketEnginePrivate *)remaining.__r)->data->controlSocket;
        uVar3 = QDeadlineTimer::remainingTime();
        uVar5 = (**(code **)(*(long *)&pQVar6->super_QAbstractSocket + 0xc0))(pQVar6,uVar3);
      } while ((uVar5 & 1) != 0);
    }
    (**(code **)(*(long *)&((QSocks5SocketEnginePrivate *)remaining.__r)->data->controlSocket->
                           super_QAbstractSocket + 0x70))();
  }
  (((QSocks5SocketEnginePrivate *)remaining.__r)->super_QAbstractSocketEnginePrivate).
  outboundStreamCount = 0;
  (((QSocks5SocketEnginePrivate *)remaining.__r)->super_QAbstractSocketEnginePrivate).
  inboundStreamCount = 0;
  if ((((QSocks5SocketEnginePrivate *)remaining.__r)->udpData != (QSocks5UdpAssociateData *)0x0) &&
     (((QSocks5SocketEnginePrivate *)remaining.__r)->udpData->udpSocket != (QUdpSocket *)0x0)) {
    (**(code **)(*(long *)&((QSocks5SocketEnginePrivate *)remaining.__r)->udpData->udpSocket->
                           super_QAbstractSocket + 0x70))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QSocks5SocketEngine::close()
{
    QSOCKS5_Q_DEBUG << "close()";
    Q_D(QSocks5SocketEngine);
    if (d->data && d->data->controlSocket) {
        if (d->data->controlSocket->state() == QAbstractSocket::ConnectedState) {
            QDeadlineTimer deadline(100ms);
            while (!d->data->controlSocket->bytesToWrite()) {
               if (!d->data->controlSocket->waitForBytesWritten(deadline.remainingTime()))
                   break;
            }
        }
        d->data->controlSocket->close();
    }
    d->inboundStreamCount = d->outboundStreamCount = 0;
#ifndef QT_NO_UDPSOCKET
    if (d->udpData && d->udpData->udpSocket)
        d->udpData->udpSocket->close();
#endif
}